

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall capnp::compiler::Compiler::Impl::Impl(Impl *this,AnnotationFlag annotationFlag)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  Node *pNVar3;
  mapped_type *ppNVar4;
  mapped_type *this_00;
  bool bVar5;
  IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
  local_238;
  Reader name;
  Reader params;
  StringPtr symbolName;
  Reader fieldProto;
  IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> local_1a8;
  Own<capnp::compiler::Compiler::Node,_std::nullptr_t> newNode;
  uint local_180;
  Reader local_168;
  StructSchema declSchema;
  Reader local_138;
  ReaderFor<capnp::List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>_> local_108;
  Which which;
  long *local_c8;
  uint local_b8;
  Field field;
  FieldList local_68;
  
  (this->super_LazyLoadCallback)._vptr_LazyLoadCallback = (_func_int **)&PTR_load_002047e8;
  this->annotationFlag = annotationFlag;
  kj::Arena::Arena(&this->nodeArena,0x400);
  (this->modules)._M_h._M_buckets = &(this->modules)._M_h._M_single_bucket;
  (this->modules)._M_h._M_bucket_count = 1;
  (this->modules)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->modules)._M_h._M_element_count = 0;
  (this->modules)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->modules)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->modules)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Workspace::Workspace(&this->workspace,&this->super_LazyLoadCallback);
  (this->nodesById)._M_h._M_buckets = &(this->nodesById)._M_h._M_single_bucket;
  (this->nodesById)._M_h._M_bucket_count = 1;
  (this->nodesById)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nodesById)._M_h._M_element_count = 0;
  (this->nodesById)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nodesById)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nodesById)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sourceInfoById)._M_h._M_buckets = &(this->sourceInfoById)._M_h._M_single_bucket;
  (this->sourceInfoById)._M_h._M_bucket_count = 1;
  (this->sourceInfoById)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sourceInfoById)._M_h._M_element_count = 0;
  (this->sourceInfoById)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sourceInfoById)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sourceInfoById)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->builtinDecls)._M_t._M_impl.super__Rb_tree_header;
  (this->builtinDecls)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->builtinDecls)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->builtinDecls)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->builtinDecls)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->builtinDecls)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  p_Var1 = &(this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header;
  (this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->nextBogusId = 1000;
  declSchema.super_Schema.raw = (Schema)((long)schemas::s_96efe787c17e83bb + 0x48);
  StructSchema::getFields(&local_68,&declSchema);
  local_1a8.index = 0;
  local_1a8.container = &local_68;
  do {
    if (local_1a8.index == local_68.list.reader.elementCount) {
      return;
    }
    capnp::_::IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
    operator*(&field,&local_1a8);
    fieldProto._reader.dataSize = field.proto._reader.dataSize;
    fieldProto._reader.pointerCount = field.proto._reader.pointerCount;
    fieldProto._reader._38_2_ = field.proto._reader._38_2_;
    uVar2 = fieldProto._reader._32_8_;
    fieldProto._reader.nestingLimit = field.proto._reader.nestingLimit;
    fieldProto._reader._44_4_ = field.proto._reader._44_4_;
    fieldProto._reader.data = field.proto._reader.data;
    fieldProto._reader.pointers = field.proto._reader.pointers;
    fieldProto._reader.segment = field.proto._reader.segment;
    fieldProto._reader.capTable = field.proto._reader.capTable;
    fieldProto._reader.dataSize = field.proto._reader.dataSize;
    bVar5 = 0x1f < fieldProto._reader.dataSize;
    fieldProto._reader._32_8_ = uVar2;
    if ((bVar5) && (*(short *)((long)field.proto._reader.data + 2) != 0)) {
      name = capnp::schema::Field::Reader::getName(&fieldProto);
      params.reader.segment = (SegmentReader *)0x1a6b6f;
      params.reader.capTable = (CapTableReader *)0x8;
      bVar5 = kj::StringPtr::startsWith(&name.super_StringPtr,(StringPtr *)&params);
      if (bVar5) {
        symbolName.content.ptr = name.super_StringPtr.content.ptr + 7;
        symbolName.content.size_ = name.super_StringPtr.content.size_ - 7;
        params.reader.ptr = (byte *)0x0;
        params.reader._24_6_ = 0;
        params.reader.step._2_2_ = 0;
        params.reader.structDataSize = 0;
        params.reader.structPointerCount = 0;
        params.reader.segment = (SegmentReader *)0x0;
        params.reader.capTable = (CapTableReader *)0x0;
        params.reader.elementSize = INLINE_COMPOSITE;
        params.reader.nestingLimit = 0x7fffffff;
        capnp::schema::Field::Reader::getAnnotations((Reader *)&newNode,&fieldProto);
        local_238.container = (Reader *)&newNode;
        for (local_238.index = 0; local_238.index != local_180;
            local_238.index = local_238.index + 1) {
          capnp::_::
          IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
          ::operator*((Reader *)&which,&local_238);
          if ((0x3f < local_b8) && (*local_c8 == -0x6bf663c0614cd295)) {
            capnp::schema::Annotation::Reader::getValue(&local_138,(Reader *)&which);
            local_168.reader.nestingLimit = local_138._reader.nestingLimit;
            local_168.reader.pointer = local_138._reader.pointers;
            if (local_138._reader.pointerCount == 0) {
              local_168.reader.pointer = (WirePointer *)0x0;
              local_168.reader.nestingLimit = 0x7fffffff;
            }
            local_168.reader.segment._0_4_ = 0;
            local_168.reader.segment._4_4_ = 0;
            local_168.reader.capTable._0_4_ = 0;
            local_168.reader.capTable._4_4_ = 0;
            if (local_138._reader.pointerCount != 0) {
              local_168.reader.segment._0_4_ = local_138._reader.segment._0_4_;
              local_168.reader.segment._4_4_ = local_138._reader.segment._4_4_;
              local_168.reader.capTable._0_4_ = local_138._reader.capTable._0_4_;
              local_168.reader.capTable._4_4_ = local_138._reader.capTable._4_4_;
            }
            AnyPointer::Reader::
            getAs<capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>>
                      (&local_108,&local_168);
            params.reader._32_6_ = local_108.reader._32_6_;
            params.reader.elementSize = local_108.reader.elementSize;
            params.reader._39_1_ = local_108.reader._39_1_;
            params.reader.nestingLimit = local_108.reader.nestingLimit;
            params.reader._44_4_ = local_108.reader._44_4_;
            params.reader.ptr = local_108.reader.ptr;
            params.reader._24_6_ = local_108.reader._24_6_;
            params.reader.step._2_2_ = local_108.reader.step._2_2_;
            params.reader.segment = local_108.reader.segment;
            params.reader.capTable = local_108.reader.capTable;
            break;
          }
        }
        which = ~FILE;
        if (0x1f < fieldProto._reader.dataSize) {
          which = ~*(ushort *)((long)fieldProto._reader.data + 2);
        }
        kj::Arena::
        allocateOwn<capnp::compiler::Compiler::Node,kj::StringPtr&,capnp::compiler::Declaration::Which&,capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>::Reader&>
                  ((Arena *)&newNode,(StringPtr *)&this->nodeArena,(Which *)&symbolName,
                   (Reader *)&which);
        pNVar3 = newNode.ptr;
        ppNVar4 = std::
                  map<capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*,_std::less<capnp::compiler::Declaration::Which>,_std::allocator<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>_>
                  ::operator[](&this->builtinDeclsByKind,(key_type *)&which);
        *ppNVar4 = pNVar3;
        this_00 = std::
                  map<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
                  ::operator[](&this->builtinDecls,&symbolName);
        kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>::operator=(this_00,&newNode);
        kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>::dispose(&newNode);
      }
    }
    local_1a8.index = local_1a8.index + 1;
  } while( true );
}

Assistant:

Compiler::Impl::Impl(AnnotationFlag annotationFlag)
    : annotationFlag(annotationFlag), workspace(*this) {
  // Reflectively interpret the members of Declaration.body.  Any member prefixed by "builtin"
  // defines a builtin declaration visible in the global scope.

  StructSchema declSchema = Schema::from<Declaration>();
  for (auto field: declSchema.getFields()) {
    auto fieldProto = field.getProto();
    if (fieldProto.getDiscriminantValue() != schema::Field::NO_DISCRIMINANT) {
      auto name = fieldProto.getName();
      if (name.startsWith("builtin")) {
        kj::StringPtr symbolName = name.slice(strlen("builtin"));

        List<Declaration::BrandParameter>::Reader params;
        for (auto annotation: fieldProto.getAnnotations()) {
          if (annotation.getId() == 0x94099c3f9eb32d6bull) {
            params = annotation.getValue().getList().getAs<List<Declaration::BrandParameter>>();
            break;
          }
        }

        Declaration::Which which =
            static_cast<Declaration::Which>(fieldProto.getDiscriminantValue());
        kj::Own<Node> newNode = nodeArena.allocateOwn<Node>(symbolName, which, params);
        builtinDeclsByKind[which] = newNode;
        builtinDecls[symbolName] = kj::mv(newNode);
      }
    }
  }
}